

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

bool __thiscall helics::EndpointInfo::updateTimeUpTo(EndpointInfo *this,Time newTime)

{
  int iVar1;
  int iVar2;
  _Elt_pointer puVar3;
  _Map_pointer ppuVar4;
  _Elt_pointer puVar5;
  handle handle;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock(&local_30,&this->message_queue);
  puVar3 = ((local_30.data)->
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar5 = ((local_30.data)->
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  ppuVar4 = ((local_30.data)->
            super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  iVar2 = 0;
  while ((puVar3 != ((local_30.data)->
                    super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_cur &&
         ((((puVar3->_M_t).
            super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode <
          newTime.internalTimeCode))) {
    iVar2 = iVar2 + 1;
    puVar3 = puVar3 + 1;
    if (puVar3 == puVar5) {
      puVar3 = ppuVar4[1];
      ppuVar4 = ppuVar4 + 1;
      puVar5 = puVar3 + 0x40;
    }
  }
  iVar1 = (this->mAvailableMessages).super___atomic_base<int>._M_i;
  if (iVar1 != iVar2) {
    LOCK();
    (this->mAvailableMessages).super___atomic_base<int>._M_i = iVar2;
    UNLOCK();
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30.m_handle_lock);
  return iVar1 != iVar2;
}

Assistant:

bool EndpointInfo::updateTimeUpTo(Time newTime)
{
    int index{0};
    auto handle = message_queue.lock();

    auto message = handle.begin();
    auto it_final = handle.end();
    while (message != it_final) {
        if ((*message)->time >= newTime) {
            break;
        }
        ++index;
        ++message;
    }
    if (index != mAvailableMessages.load()) {
        mAvailableMessages.store(index);
        return true;
    }
    return false;
}